

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int CVmObjDate::parse_date_string
              (int32_t *dayno,int32_t *daytime,char *str,vm_val_t *custom,CVmDateLocale *lc,
              multicaldate_t *cal,int32_t refday,int32_t reftime,CVmTimeZone *reftz,
              date_parse_result *resultp,date_parse_string *fmtlist,int *nfmtlist)

{
  size_t sVar1;
  size_t fmtl;
  int32_t *dayno_00;
  int32_t *daytime_00;
  int iVar2;
  int32_t iVar3;
  char *pcVar4;
  char *pcVar5;
  void *pvVar6;
  uint uVar7;
  CVmTimeZone *pCVar8;
  char *pcVar9;
  uint local_434;
  ulong local_430;
  int local_428;
  int local_424;
  long local_420;
  size_t curfmtl;
  undefined4 local_40c;
  multicaldate_t *local_408;
  CVmTimeZone *local_400;
  char *curstr;
  int32_t *local_3f0;
  int32_t *local_3e8;
  vm_val_t *local_3e0;
  multicaldate_t *local_3d8;
  char *local_3d0;
  date_parse_string *local_3c8;
  CVmDateLocale *local_3c0;
  size_t curlen;
  size_t filterlen;
  int local_3a8;
  int iStack_3a4;
  undefined8 uStack_3a0;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  date_parse_result local_370;
  date_parse_result local_258;
  format_iter fi;
  undefined1 local_104 [4];
  undefined1 local_100 [208];
  
  local_430 = (ulong)*(ushort *)str;
  pcVar9 = str + 2;
  local_3f0 = dayno;
  local_3e8 = daytime;
  local_3e0 = custom;
  local_3c0 = lc;
  local_3d0 = CVmDateLocale::get(lc,&filterlen,6);
  pCVar8 = (CVmTimeZone *)0x0;
  memset(&local_370.pera,0,0xd0);
  local_370.era = 0;
  local_370.yy = -0x80000000;
  local_370.mm = -0x80000000;
  local_370.dd = -0x80000000;
  local_370.mi = -0x80000000;
  local_370.ss = -0x80000000;
  local_370.ms = -0x80000000;
  local_370.tzofs = -0x80000000;
  local_370.w = -0x80000000;
  local_370.yy_needs_century = 0;
  local_370.ampm = 0;
  local_370.hh = -0x80000000;
  local_370.tz = (CVmTimeZone *)0x0;
  local_420 = 0;
  local_3d8 = cal;
  local_370.cal = cal;
  do {
    if (local_430 == 0) {
      if (pCVar8 == (CVmTimeZone *)0x0) {
        local_370.tz = reftz;
      }
      date_parse_result::utc_to_local(&local_370,&refday,&reftime);
      date_parse_result::def_date(&local_370,refday);
      date_parse_result::def_time(&local_370,0,0,0,0);
      iVar3 = date_parse_result::dayno(&local_370);
      daytime_00 = local_3e8;
      dayno_00 = local_3f0;
      *local_3f0 = iVar3;
      *local_3e8 = local_370.ss * 1000 + local_370.mi * 60000 + local_370.hh * 3600000 +
                   local_370.ms;
      caldate_t::normalize(local_3f0,local_3e8);
      date_parse_result::local_to_utc(&local_370,dayno_00,daytime_00);
      if (resultp != (date_parse_result *)0x0) {
        memcpy(resultp,&local_370,0x118);
      }
      if (nfmtlist != (int *)0x0) {
        *nfmtlist = (int)local_420;
      }
      return 1;
    }
    local_400 = (CVmTimeZone *)0x0;
    memset(local_100,0,0xd0);
    format_iter::format_iter(&fi,parse_date_string::fmt,0x37,local_3e0);
    local_3c8 = fmtlist + local_420;
    local_424 = -0x80000000;
    local_428 = -0x80000000;
    local_408 = local_3d8;
    local_434 = 0;
    local_388 = 0;
    iStack_384 = -0x80000000;
    iStack_380 = -0x80000000;
    iStack_37c = -0x80000000;
    local_398 = -0x80000000;
    iStack_394 = 0;
    iStack_390 = 0;
    iStack_38c = -0x80000000;
    local_3a8 = -0x80000000;
    iStack_3a4 = -0x80000000;
    uStack_3a0 = 0;
LAB_0024b55d:
    pcVar4 = format_iter::next(&fi,&curfmtl);
    pCVar8 = local_400;
    sVar1 = curfmtl;
    if (pcVar4 != (char *)0x0) {
      curlen = local_430;
      pcVar5 = pcVar4;
      curstr = pcVar9;
      if ((2 < curfmtl) && (*pcVar4 == '[')) break;
      goto LAB_0024b612;
    }
    if (local_434 == 0) {
      return 0;
    }
    pcVar4 = pcVar9 + local_434;
    local_370.cal = local_408;
    local_370.era = local_388;
    local_370.yy = iStack_384;
    local_370.mm = iStack_380;
    local_370.dd = iStack_37c;
    local_370.w = local_398;
    local_370.yy_needs_century = iStack_394;
    local_370.ampm = iStack_390;
    local_370.hh = iStack_38c;
    local_370.mi = local_3a8;
    local_370.ss = iStack_3a4;
    local_370.ms = local_428;
    local_370._52_4_ = local_40c;
    local_370.tz = local_400;
    local_370.tzofs = local_424;
    memcpy(&local_370.field_0x44,local_104,0xd4);
    pcVar5 = pcVar9 + local_430;
    local_430 = local_430 - local_434;
    while ((pcVar9 = pcVar5, local_430 != 0 &&
           (pvVar6 = memchr(" \t;,:",(int)*pcVar4,6), pcVar9 = pcVar4, pvVar6 != (void *)0x0))) {
      pcVar4 = pcVar4 + 1;
      local_430 = local_430 - 1;
    }
    local_420 = local_420 + 1;
  } while( true );
  pcVar5 = lib_strnchr(pcVar4 + 1,curfmtl - 1,0x5d);
  if ((pcVar5 == (char *)0x0) ||
     ((pcVar5 + ~(ulong)pcVar4 == (char *)(long)(int)filterlen &&
      (iVar2 = memicmp(pcVar4 + 1,local_3d0,filterlen), iVar2 == 0)))) {
    curfmtl = (size_t)(pcVar4 + curfmtl + ~(ulong)pcVar5);
    pcVar5 = pcVar5 + 1;
LAB_0024b612:
    fmtl = curfmtl;
    memcpy(&local_258,&local_370,0x118);
    iVar2 = parse_string_fmt(&local_258,&curstr,&curlen,pcVar5,fmtl,local_3c0);
    if (iVar2 != 0) {
      uVar7 = (int)curstr - (int)pcVar9;
      if ((int)local_434 < (int)uVar7) {
        local_408 = local_258.cal;
        local_388 = local_258.era;
        iStack_384 = local_258.yy;
        iStack_380 = local_258.mm;
        iStack_37c = local_258.dd;
        local_398 = local_258.w;
        iStack_394 = local_258.yy_needs_century;
        iStack_390 = local_258.ampm;
        iStack_38c = local_258.hh;
        local_3a8 = local_258.mi;
        iStack_3a4 = local_258.ss;
        uStack_3a0 = 0;
        local_428 = local_258.ms;
        local_40c = local_258._52_4_;
        local_400 = local_258.tz;
        local_424 = local_258.tzofs;
        memcpy(local_104,&local_258.field_0x44,0xd4);
        local_434 = uVar7;
        if ((nfmtlist != (int *)0x0) && (local_420 < *nfmtlist)) {
          local_3c8->p = pcVar4;
          local_3c8->len = sVar1;
        }
      }
    }
  }
  goto LAB_0024b55d;
}

Assistant:

int CVmObjDate::parse_date_string(
    VMG_ int32_t &dayno, int32_t &daytime,
    const char *str, const vm_val_t *custom, CVmDateLocale *lc,
    multicaldate_t *cal, int32_t refday, int32_t reftime, CVmTimeZone *reftz,
    date_parse_result *resultp, date_parse_string *fmtlist, int *nfmtlist)
{
    /* get the string length and buffer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* format list */
    static const char *fmt[] =
    {
        /* US-style dates, with the month first */
        "[us]m / d / y",
        "[us]m / d",
        "[us]m - d",
        "[us]m . d",
        "[us]m .\t- d .\t- y",

        /* European-style date formats, with day/month order */
        "[eu]d / m / y",
        "[eu]d / m",
        "[eu]d - m",
        "[eu]d . m",
        "[eu]d .\t- m .\t- y",

        /* match some special computer formats first */
        "yyyy mm dd",                             /* 8-digit year month day */
        "yyyy .? doy",                   /* PostreSQL year with day-of-year */

        /* universal date formats */
        "m / y",
        "m - y",
        "month _.\t-* ddth _,.\t+ ye",
        "ddth _.\t-* month _,.\t-* ye",
        "month _.\t-* ddth",
        "ddth _.\t-* month",
        "month - dd - ye",
        "month _\t.-* y",
        "month",
        "+- y - mm - dd",
        "y / m / d",
        "y - m - d",
        "y / m",
        "y - m",
        "ye _\t.-* month _\t.-* d",
        "ye _\t.-* month",
        "ye - month - dd",
        "yyyy",
        "era _* y",
        "y _* era",

        /* time formats */
        "h _? ampm",
        "h : mi",
        "h .: mi _? ampm",
        "h .: mi .: ss _? ampm",
        "h : mi : ss",
        "h : mi : ss .: ssfrac _? ampm",
        "h : mi : ss .: ssfrac",
        "tT? hh .: mi",
        "tT? hh mi",
        "tT? hh .: mi .: ss",
        "tT? hh mi SS",
        "tT? hh .: mi .: ss _? tz",
        "tT? hh .: mi .: ss . ssfrac",
        "tz",

        /* special formats (ISO, other software, etc) */
        "d / mon / yyyy : hh : mi : ss _ gmtofs",         /* Unix log files */
        "yyyy : mm : dd _ hh : mi : ss",                            /* EXIF */
        "yyyy -? \\W W",                          /* ISO year with ISO week */
        "yyyy - mm - dd \\T hh : mi : ss . ssfrac",                 /* SOAP */
        "yyyy - mm - dd \\T hh : mi : ss . ssfrac gmtofs",          /* SOAP */
        "@ unix",                                         /* Unix timestamp */
        "yyyy mm dd \\T hh : mi : ss",                            /* XMLRPC */
        "yyyy mm dd \\t hh mi ss",                      /* XMLRPC - compact */
        "yyyy - m - d \\T h : i : s"                                /* WDDX */
    };

    /* get the template filter in "[xx]" format */
    size_t filterlen;
    const char *filter = lc->get(vmg_ filterlen, LC_PARSE_FILTER);
    
    /* keep separate results for each pass */
    date_parse_result result(cal);

    /*
     *   Run through the format list as many times as it takes to either
     *   consume the whole source string, or fail to find a matching format.
     *   We have multiple format parts that can be specified individually or
     *   in combination (time, date, time + date, date + time, etc).
     */
    int fcapi;
    for (fcapi = 0 ; len != 0 ; ++fcapi)
    {
        /* we haven't found a best result for this pass yet */
        int bestlen = 0;
        date_parse_result bestres(cal);
        
        /* search the list for a match */
        format_iter fi(vmg_ fmt, countof(fmt), custom);
        size_t curfmtl;
        const char *curfmt;
        while ((curfmt = fi.next(vmg_ curfmtl)) != 0)
        {
            /* set up at the current position */
            const char *curstr = str;
            size_t curlen = len;

            /* remember the original format string */
            const char *curfmt0 = curfmt;
            size_t curfmtl0 = curfmtl;

            /* if this is a "[us]" or "[eu]" local entry, filter it */
            if (curfmtl >= 3 && curfmt[0] == '[')
            {
                /* get the ']' */
                const char *rb = lib_strnchr(curfmt+1, curfmtl-1, ']');

                /* 
                 *   if we found it, and the contents of the brackets don't
                 *   match the locale filter string, filter out this format 
                 */
                if (rb != 0
                    && (rb - curfmt - 1 != (int)filterlen
                        || memicmp(curfmt + 1, filter, filterlen) != 0))
                    continue;

                /* skip the filter string */
                curfmtl -= rb - curfmt + 1;
                curfmt = rb + 1;
            }

            /* start with the results from previous passes */
            date_parse_result curres(result);

            /* try matching this format at the current position */
            if (parse_string_fmt(vmg_ &curres, curstr, curlen,
                                 curfmt, curfmtl, lc))
            {
                /* if this is the longest match of this pass, keep it */
                int reslen = curstr - str;
                if (reslen > bestlen)
                {
                    /* remember this as the best result so far */
                    bestlen = reslen;
                    bestres = curres;

                    /* remember the format string it matches, if desired */
                    if (nfmtlist != 0 && fcapi < *nfmtlist)
                        fmtlist[fcapi].set(curfmt0, curfmtl0);
                }
            }
        }

        /* if we didn't find a match on this round, we've failed */
        if (bestlen == 0)
            return FALSE;

        /* skip what we matched for the best result of this pass */
        str += bestlen;
        len -= bestlen;

        /* keep the best result for this pass */
        result = bestres;

        /* skip spaces and other separator characters */
        for ( ; len != 0 && strchr(" \t;,:", *str) != 0 ; ++str, --len) ;
    }

    /* default to the reference time zone */
    result.def_tz(reftz);

    /* adjust the reference time to the appropriate local time zone */
    result.utc_to_local(refday, reftime);

    /* set missing date elements to the corresponding reference date values */
    result.def_date(refday);
    
    /* set any missing time elements to midnight or zero past the hour/min */
    result.def_time(0, 0, 0, 0);

    /* convert to our internal day and time representation */
    dayno = result.dayno();
    daytime = result.daytime();
    caldate_t::normalize(dayno, daytime);

    /* translate the final time value from the specified local time to UTC */
    result.local_to_utc(dayno, daytime);

    /* copy back the results if the caller's interested */
    if (resultp != 0)
        memcpy(resultp, &result, sizeof(result));

    /* tell the caller how many format strings we matched, if desired */
    if (nfmtlist != 0)
        *nfmtlist = fcapi;

    /* success */
    return TRUE;
}